

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

char * get_setting(char *key)

{
  void *pvVar1;
  skeyval *ret;
  skeyval tmp;
  char *key_local;
  
  ret = (skeyval *)key;
  tmp.value = key;
  if ((xrmtree == (tree234 *)0x0) ||
     (pvVar1 = find234(xrmtree,&ret,(cmpfn234)0x0), pvVar1 == (void *)0x0)) {
    key_local = x_get_default(tmp.value);
  }
  else {
    key_local = *(char **)((long)pvVar1 + 8);
  }
  return key_local;
}

Assistant:

static const char *get_setting(const char *key)
{
    struct skeyval tmp, *ret;
    tmp.key = key;
    if (xrmtree) {
        ret = find234(xrmtree, &tmp, NULL);
        if (ret)
            return ret->value;
    }
    return x_get_default(key);
}